

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O1

UMutableCPTrie *
umutablecptrie_open_63(uint32_t initialValue,uint32_t errorValue,UErrorCode *pErrorCode)

{
  MutableCodePointTrie *this;
  undefined4 in_register_00000034;
  void *p;
  MutableCodePointTrie *pMVar1;
  
  p = (void *)CONCAT44(in_register_00000034,errorValue);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (MutableCodePointTrie *)icu_63::UMemory::operator_new((UMemory *)0x11040,(size_t)p);
    if (this == (MutableCodePointTrie *)0x0) {
      this = (MutableCodePointTrie *)0x0;
    }
    else {
      p = (void *)(ulong)initialValue;
      icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
                (this,initialValue,errorValue,pErrorCode);
    }
    if ((this == (MutableCodePointTrie *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    pMVar1 = (MutableCodePointTrie *)0x0;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pMVar1 = this;
    }
    if (this != (MutableCodePointTrie *)0x0 && U_ZERO_ERROR < *pErrorCode) {
      icu_63::anon_unknown_0::MutableCodePointTrie::~MutableCodePointTrie(this);
      icu_63::UMemory::operator_delete((UMemory *)this,p);
    }
  }
  else {
    pMVar1 = (MutableCodePointTrie *)0x0;
  }
  return (UMutableCPTrie *)pMVar1;
}

Assistant:

int32_t getAllSameOverlap(const uint32_t *p, int32_t length, uint32_t value,
                          int32_t blockLength) {
    int32_t min = length - (blockLength - 1);
    int32_t i = length;
    while (min < i && p[i - 1] == value) { --i; }
    return length - i;
}